

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

void __thiscall randomx::Instruction::h_IMUL_RCP(Instruction *this,ostream *os)

{
  byte bVar1;
  ostream *poVar2;
  
  bVar1 = this->dst;
  std::__ostream_insert<char,std::char_traits<char>>(os,"r",1);
  poVar2 = (ostream *)std::ostream::operator<<(os,bVar1 & 7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void Instruction::h_IMUL_RCP(std::ostream& os) const {
		auto dstIndex = dst % RegistersCount;
		os << "r" << dstIndex << ", " << getImm32() << std::endl;
	}